

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
baseObject::drawParametricEquation
          (baseObject *this,_func_point_double *func,range *_rangeT,int cDivSteps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  double dVar8;
  point pVar9;
  point pt;
  bezierPoint dPoint;
  point local_c8;
  double local_b0;
  double local_a8;
  double dStack_a0;
  vector<bezierPoint,_std::allocator<bezierPoint>_> *local_98;
  double local_90;
  double local_88;
  double dStack_80;
  double local_78;
  value_type local_68;
  
  local_90 = (_rangeT->max - _rangeT->min) / (double)cDivSteps;
  local_68.pt[2].x = 0.0;
  local_68.pt[2].y = 0.0;
  local_68.pt[1].x = 0.0;
  local_68.pt[1].y = 0.0;
  local_68.pt[0].x = 0.0;
  local_68.pt[0].y = 0.0;
  local_b0 = local_90 / 3.0;
  local_98 = &this->curves;
  for (uVar4 = 0; uVar4 <= (ulong)(long)cDivSteps; uVar4 = uVar4 + 1) {
    auVar7._8_4_ = (int)(uVar4 >> 0x20);
    auVar7._0_8_ = uVar4;
    auVar7._12_4_ = 0x45300000;
    dStack_a0 = auVar7._8_8_ - 1.9342813113834067e+25;
    local_a8 = (dStack_a0 + ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) *
               local_90 + _rangeT->min;
    local_c8 = (*func)(local_a8);
    std::vector<_point,_std::allocator<_point>_>::push_back(&this->points,&local_c8);
    dVar8 = (this->rangeX).min;
    dVar1 = (this->rangeX).max;
    dVar2 = (this->rangeY).min;
    dVar3 = (this->rangeY).max;
    uVar5 = -(ulong)(local_c8.x < dVar8);
    uVar6 = -(ulong)(dVar1 < local_c8.x);
    (this->rangeX).min = (double)(~uVar5 & (ulong)dVar8 | (ulong)local_c8.x & uVar5);
    (this->rangeX).max = (double)(~uVar6 & (ulong)dVar1 | (ulong)local_c8.x & uVar6);
    uVar5 = -(ulong)(local_c8.y < dVar2);
    uVar6 = -(ulong)(dVar3 < local_c8.y);
    dVar8 = (double)(~uVar6 & (ulong)dVar3 | (ulong)local_c8.y & uVar6);
    (this->rangeY).min = (double)(~uVar5 & (ulong)dVar2 | (ulong)local_c8.y & uVar5);
    (this->rangeY).max = dVar8;
    pVar9 = (*func)(local_a8 - local_b0);
    local_88 = pVar9.y;
    local_78 = pVar9.x;
    dStack_80 = dVar8;
    pVar9 = (*func)(local_a8 + local_b0);
    local_a8 = (pVar9.x - local_78) * 0.5;
    dStack_a0 = (pVar9.y - local_88) * 0.5;
    local_68.pt[1].x = local_c8.x - local_a8;
    local_68.pt[1].y = local_c8.y - dStack_a0;
    local_68.pt[2].x = local_c8.x;
    local_68.pt[2].y = local_c8.y;
    if (uVar4 != 0) {
      std::vector<bezierPoint,_std::allocator<bezierPoint>_>::push_back(local_98,&local_68);
    }
    local_68.pt[0].x = local_a8 + local_c8.x;
    local_68.pt[0].y = dStack_a0 + local_c8.y;
  }
  return;
}

Assistant:

void drawParametricEquation(point (*func)(double), const range& _rangeT, const int cDivSteps)
    {
        double cStep = _rangeT.getSpan() / cDivSteps;
        //rangeX = _rangeX;

        // for differentials
        bezierPoint dPoint;
        double dStep = cStep / 3.;

        for (size_t i = 0; i <= cDivSteps; i++)
        {
            double t = _rangeT.min + i * cStep;
            point pt = func(t);
            points.push_back(pt);

            // check the range of Y
            rangeX.min = pt.x < rangeX.min ? pt.x : rangeX.min;
            rangeX.max = pt.x > rangeX.max ? pt.x : rangeX.max;
            rangeY.min = pt.y < rangeY.min ? pt.y : rangeY.min;
            rangeY.max = pt.y > rangeY.max ? pt.y : rangeY.max;

            // compute differentials
            point diff[] = { func(t - dStep), func(t + dStep) };
            double slope = (diff[1].y - diff[0].y) / 2.;
            double xStep = (diff[1].x - diff[0].x) / 2.;
            dPoint.pt[1] = point(pt.x - xStep, pt.y - slope);
            dPoint.pt[2] = pt;
            if (i != 0)
            { // skip first iteration
                curves.push_back(dPoint);
            }
            dPoint.pt[0] = point(pt.x + xStep, pt.y + slope);
        }
    }